

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O0

bool __thiscall
FTTYStartupScreen::NetLoop
          (FTTYStartupScreen *this,_func_bool_void_ptr *timer_callback,void *userdata)

{
  bool bVar1;
  ssize_t sVar2;
  fd_set *__arr;
  char local_bd;
  uint __i;
  undefined1 auStack_b8 [3];
  char k;
  int retval;
  timeval tv;
  fd_set rfds;
  void *userdata_local;
  _func_bool_void_ptr *timer_callback_local;
  FTTYStartupScreen *this_local;
  
  do {
    while( true ) {
      do {
        _auStack_b8 = 0;
        tv.tv_sec = 500000;
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          rfds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
        }
        tv.tv_usec = tv.tv_usec | 1;
        __i = select(1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_b8);
      } while (__i == 0xffffffff);
      if (__i != 0) break;
      bVar1 = (*timer_callback)(userdata);
      if (bVar1) {
        fputc(10,_stderr);
        return true;
      }
    }
    sVar2 = ::read(0,&local_bd,1);
  } while ((sVar2 != 1) || ((local_bd != 'q' && (local_bd != 'Q'))));
  fprintf(_stderr,"\nNetwork game synchronization aborted.");
  return false;
}

Assistant:

bool FTTYStartupScreen::NetLoop(bool (*timer_callback)(void *), void *userdata)
{
	fd_set rfds;
	struct timeval tv;
	int retval;
	char k;

	for (;;)
	{
		// Don't flood the network with packets on startup.
		tv.tv_sec = 0;
		tv.tv_usec = 500000;

		FD_ZERO (&rfds);
		FD_SET (STDIN_FILENO, &rfds);

		retval = select (1, &rfds, NULL, NULL, &tv);

		if (retval == -1)
		{
			// Error
		}
		else if (retval == 0)
		{
			if (timer_callback (userdata))
			{
				fputc ('\n', stderr);
				return true;
			}
		}
		else if (read (STDIN_FILENO, &k, 1) == 1)
		{
			// Check input on stdin
			if (k == 'q' || k == 'Q')
			{
				fprintf (stderr, "\nNetwork game synchronization aborted.");
				return false;
			}
		}
	}
}